

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::PageHeader::write(PageHeader *this,int __fd,void *__buf,size_t __n)

{
  _PageHeader__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ssize_t sVar12;
  size_t sVar13;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *this_01;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"PageHeader");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"type",8,1);
  iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->type);
  iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar6 = (*this_00->_vptr_TProtocol[6])(this_00,"uncompressed_page_size",8,2);
  iVar7 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->uncompressed_page_size);
  iVar8 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar9 = (*this_00->_vptr_TProtocol[6])(this_00,"compressed_page_size",8,3);
  iVar10 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->compressed_page_size);
  iVar11 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar9 + iVar10 + iVar11 + iVar6 + iVar7 + iVar8 + iVar4 + iVar5 + iVar3 + iVar2;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"crc",8,4);
    iVar4 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->crc);
    iVar5 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar4 + iVar5 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    sVar13 = 5;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"data_page_header",0xc);
    sVar12 = DataPageHeader::write(&this->data_page_header,__fd,__buf_00,sVar13);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar12 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    sVar13 = 6;
    this_01 = this_00;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"index_page_header",0xc);
    sVar12 = IndexPageHeader::write((IndexPageHeader *)this_01,__fd,__buf_01,sVar13);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar12 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 8) != 0) {
    sVar13 = 7;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"dictionary_page_header",0xc);
    sVar12 = DictionaryPageHeader::write(&this->dictionary_page_header,__fd,__buf_02,sVar13);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar12 + iVar4 + iVar3 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 0x10) != 0) {
    sVar13 = 8;
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"data_page_header_v2",0xc);
    sVar12 = DataPageHeaderV2::write(&this->data_page_header_v2,__fd,__buf_03,sVar13);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = (int)sVar12 + iVar4 + iVar3 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t PageHeader::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("PageHeader");

  xfer += oprot->writeFieldBegin("type", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(static_cast<int32_t>(this->type));
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("uncompressed_page_size", ::apache::thrift::protocol::T_I32, 2);
  xfer += oprot->writeI32(this->uncompressed_page_size);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("compressed_page_size", ::apache::thrift::protocol::T_I32, 3);
  xfer += oprot->writeI32(this->compressed_page_size);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.crc) {
    xfer += oprot->writeFieldBegin("crc", ::apache::thrift::protocol::T_I32, 4);
    xfer += oprot->writeI32(this->crc);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.data_page_header) {
    xfer += oprot->writeFieldBegin("data_page_header", ::apache::thrift::protocol::T_STRUCT, 5);
    xfer += this->data_page_header.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.index_page_header) {
    xfer += oprot->writeFieldBegin("index_page_header", ::apache::thrift::protocol::T_STRUCT, 6);
    xfer += this->index_page_header.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.dictionary_page_header) {
    xfer += oprot->writeFieldBegin("dictionary_page_header", ::apache::thrift::protocol::T_STRUCT, 7);
    xfer += this->dictionary_page_header.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.data_page_header_v2) {
    xfer += oprot->writeFieldBegin("data_page_header_v2", ::apache::thrift::protocol::T_STRUCT, 8);
    xfer += this->data_page_header_v2.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}